

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O1

String * __thiscall
Jinx::Impl::FunctionSignature::GetName_abi_cxx11_
          (String *__return_storage_ptr__,FunctionSignature *this)

{
  size_type __n;
  pointer pbVar1;
  pointer pbVar2;
  char *pcVar3;
  pointer pFVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (__return_storage_ptr__,0x20);
  __n = (this->m_libraryName)._M_string_length;
  if (__n != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_append
              (__return_storage_ptr__,(this->m_libraryName)._M_dataplus._M_p,__n);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
              (__return_storage_ptr__," ");
  }
  pFVar4 = (this->m_parts).
           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar4 != (this->m_parts).
                super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (pFVar4->partType == Name) {
        if (pFVar4->optional == true) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                    (__return_storage_ptr__,"(");
        }
        pbVar2 = (pFVar4->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while (pbVar2 != (pFVar4->names).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                         ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          _M_append(__return_storage_ptr__,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
          pbVar2 = pbVar2 + 1;
          pbVar1 = (pFVar4->names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((pbVar2 != pbVar1) &&
             (0x20 < (ulong)((long)pbVar1 -
                            (long)(pFVar4->names).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                                  ._M_impl.super__Vector_impl_data._M_start))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                      (__return_storage_ptr__,"/");
          }
        }
        pcVar3 = ")";
        if (pFVar4->optional != false) goto LAB_00117eeb;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                  (__return_storage_ptr__,"{");
        pcVar3 = "}";
        if (pFVar4->valueType != Any) {
          pcVar3 = GetValueTypeName(pFVar4->valueType);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                    (__return_storage_ptr__,pcVar3);
          pcVar3 = "}";
        }
LAB_00117eeb:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                  (__return_storage_ptr__,pcVar3);
      }
      pFVar4 = pFVar4 + 1;
      if (pFVar4 != (this->m_parts).
                    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                  (__return_storage_ptr__," ");
      }
    } while (pFVar4 != (this->m_parts).
                       super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t String FunctionSignature::GetName() const
	{
		String fnName;
		fnName.reserve(32);
		if (!m_libraryName.empty())
		{
			fnName += m_libraryName;
			fnName += " ";
		}
		for (auto partItr = m_parts.begin(); partItr != m_parts.end();)
		{
			if (partItr->partType == FunctionSignaturePartType::Name)
			{
				if (partItr->optional)
					fnName += "(";
				for (auto nameItr = partItr->names.begin(); nameItr != partItr->names.end();)
				{
					fnName += *nameItr;
					++nameItr;
					if (nameItr != partItr->names.end() && partItr->names.size() > 1)
						fnName += "/";
				}
				if (partItr->optional)
					fnName += ")";
			}
			else
			{
				fnName += "{";
				if (partItr->valueType != ValueType::Any)
					fnName += GetValueTypeName(partItr->valueType);
				fnName += "}";
			}

			++partItr;
			if (partItr != m_parts.end())
				fnName += " ";
		}
		return fnName;
	}